

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_257,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  byte bVar21;
  char cVar22;
  undefined4 uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong *puVar30;
  ulong *puVar31;
  ulong uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar44 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar45 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar46 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar47 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  NodeRef stack [564];
  size_t local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = root.ptr;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar4 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar5 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar50._4_4_ = fVar7;
  auVar50._0_4_ = fVar7;
  auVar50._8_4_ = fVar7;
  auVar50._12_4_ = fVar7;
  auVar50._16_4_ = fVar7;
  auVar50._20_4_ = fVar7;
  auVar50._24_4_ = fVar7;
  auVar50._28_4_ = fVar7;
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar51._4_4_ = fVar8;
  auVar51._0_4_ = fVar8;
  auVar51._8_4_ = fVar8;
  auVar51._12_4_ = fVar8;
  auVar51._16_4_ = fVar8;
  auVar51._20_4_ = fVar8;
  auVar51._24_4_ = fVar8;
  auVar51._28_4_ = fVar8;
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar39._4_4_ = fVar9;
  auVar39._0_4_ = fVar9;
  auVar39._8_4_ = fVar9;
  auVar39._12_4_ = fVar9;
  auVar39._16_4_ = fVar9;
  auVar39._20_4_ = fVar9;
  auVar39._24_4_ = fVar9;
  auVar39._28_4_ = fVar9;
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar10 = (tray->tnear).field_0.i[k];
  auVar41._4_4_ = iVar10;
  auVar41._0_4_ = iVar10;
  auVar41._8_4_ = iVar10;
  auVar41._12_4_ = iVar10;
  auVar41._16_4_ = iVar10;
  auVar41._20_4_ = iVar10;
  auVar41._24_4_ = iVar10;
  auVar41._28_4_ = iVar10;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar43._4_4_ = iVar10;
  auVar43._0_4_ = iVar10;
  auVar43._8_4_ = iVar10;
  auVar43._12_4_ = iVar10;
  auVar43._16_4_ = iVar10;
  auVar43._20_4_ = iVar10;
  auVar43._24_4_ = iVar10;
  auVar43._28_4_ = iVar10;
  auVar44._0_4_ = fVar7 * -fVar1;
  auVar44._4_4_ = fVar7 * -fVar1;
  auVar44._8_4_ = fVar7 * -fVar1;
  auVar44._12_4_ = fVar7 * -fVar1;
  auVar44._16_4_ = fVar7 * -fVar1;
  auVar44._20_4_ = fVar7 * -fVar1;
  auVar44._28_36_ = in_ZMM7._28_36_;
  auVar44._24_4_ = fVar7 * -fVar1;
  auVar45._0_4_ = fVar8 * -fVar2;
  auVar45._4_4_ = fVar8 * -fVar2;
  auVar45._8_4_ = fVar8 * -fVar2;
  auVar45._12_4_ = fVar8 * -fVar2;
  auVar45._16_4_ = fVar8 * -fVar2;
  auVar45._20_4_ = fVar8 * -fVar2;
  auVar45._28_36_ = in_ZMM8._28_36_;
  auVar45._24_4_ = fVar8 * -fVar2;
  auVar46._0_4_ = fVar9 * -fVar3;
  auVar46._4_4_ = fVar9 * -fVar3;
  auVar46._8_4_ = fVar9 * -fVar3;
  auVar46._12_4_ = fVar9 * -fVar3;
  auVar46._16_4_ = fVar9 * -fVar3;
  auVar46._20_4_ = fVar9 * -fVar3;
  auVar46._28_36_ = in_ZMM9._28_36_;
  auVar46._24_4_ = fVar9 * -fVar3;
  puVar31 = local_11d0;
LAB_01684619:
  puVar30 = puVar31;
  if (puVar30 == &local_11d8) {
LAB_016849d9:
    return puVar30 != &local_11d8;
  }
  puVar31 = puVar30 + -1;
  uVar27 = puVar30[-1];
LAB_0168462d:
  if ((uVar27 & 0xf) == 0) {
    auVar15 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar27 + 0x40 + uVar28),auVar44._0_32_,auVar50)
    ;
    auVar16 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar27 + 0x40 + uVar32),auVar45._0_32_,auVar51)
    ;
    auVar12 = vpmaxsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar16));
    auVar15 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar27 + 0x40 + uVar29),auVar46._0_32_,auVar39)
    ;
    auVar16 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar27 + 0x40 + (uVar28 ^ 0x20)),auVar44._0_32_
                              ,auVar50);
    auVar17 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar27 + 0x40 + (uVar32 ^ 0x20)),auVar45._0_32_
                              ,auVar51);
    auVar33 = vpminsd_avx2(ZEXT1632(auVar16),ZEXT1632(auVar17));
    auVar16 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar27 + 0x40 + (uVar29 ^ 0x20)),auVar46._0_32_
                              ,auVar39);
    auVar13 = vpmaxsd_avx2(ZEXT1632(auVar15),auVar41);
    auVar12 = vpmaxsd_avx2(auVar12,auVar13);
    auVar13 = vpminsd_avx2(ZEXT1632(auVar16),auVar43);
    auVar13 = vpminsd_avx2(auVar33,auVar13);
    auVar12 = vpcmpgtd_avx2(auVar12,auVar13);
    uVar23 = vmovmskps_avx(auVar12);
    bVar21 = ~(byte)uVar23;
  }
  else {
    if ((int)(uVar27 & 0xf) != 2) {
      in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
      in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
      cVar22 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(uVar27 & 0xfffffffffffffff0) * 0x40 + 0x18))
                         (pre,ray,k,context);
      if (cVar22 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        goto LAB_016849d9;
      }
      goto LAB_01684619;
    }
    uVar24 = uVar27 & 0xfffffffffffffff0;
    auVar12 = *(undefined1 (*) [32])(uVar24 + 0x100);
    auVar42._4_4_ = fVar6 * auVar12._4_4_;
    auVar42._0_4_ = fVar6 * auVar12._0_4_;
    auVar42._8_4_ = fVar6 * auVar12._8_4_;
    auVar42._12_4_ = fVar6 * auVar12._12_4_;
    auVar42._16_4_ = fVar6 * auVar12._16_4_;
    auVar42._20_4_ = fVar6 * auVar12._20_4_;
    auVar42._24_4_ = fVar6 * auVar12._24_4_;
    auVar42._28_4_ = in_ZMM7._28_4_;
    auVar13 = *(undefined1 (*) [32])(uVar24 + 0x120);
    auVar47._0_4_ = fVar6 * auVar13._0_4_;
    auVar47._4_4_ = fVar6 * auVar13._4_4_;
    auVar47._8_4_ = fVar6 * auVar13._8_4_;
    auVar47._12_4_ = fVar6 * auVar13._12_4_;
    auVar47._16_4_ = fVar6 * auVar13._16_4_;
    auVar47._20_4_ = fVar6 * auVar13._20_4_;
    auVar47._28_36_ = in_ZMM10._28_36_;
    auVar47._24_4_ = fVar6 * auVar13._24_4_;
    auVar33 = *(undefined1 (*) [32])(uVar24 + 0x140);
    auVar48._0_4_ = fVar6 * auVar33._0_4_;
    auVar48._4_4_ = fVar6 * auVar33._4_4_;
    auVar48._8_4_ = fVar6 * auVar33._8_4_;
    auVar48._12_4_ = fVar6 * auVar33._12_4_;
    auVar48._16_4_ = fVar6 * auVar33._16_4_;
    auVar48._20_4_ = fVar6 * auVar33._20_4_;
    auVar48._28_36_ = in_ZMM11._28_36_;
    auVar48._24_4_ = fVar6 * auVar33._24_4_;
    auVar38._4_4_ = uVar5;
    auVar38._0_4_ = uVar5;
    auVar38._8_4_ = uVar5;
    auVar38._12_4_ = uVar5;
    auVar38._16_4_ = uVar5;
    auVar38._20_4_ = uVar5;
    auVar38._24_4_ = uVar5;
    auVar38._28_4_ = uVar5;
    auVar15 = vfmadd231ps_fma(auVar42,auVar38,*(undefined1 (*) [32])(uVar24 + 0xa0));
    auVar16 = vfmadd231ps_fma(auVar47._0_32_,auVar38,*(undefined1 (*) [32])(uVar24 + 0xc0));
    auVar17 = vfmadd231ps_fma(auVar48._0_32_,auVar38,*(undefined1 (*) [32])(uVar24 + 0xe0));
    auVar11._4_4_ = uVar4;
    auVar11._0_4_ = uVar4;
    auVar11._8_4_ = uVar4;
    auVar11._12_4_ = uVar4;
    auVar11._16_4_ = uVar4;
    auVar11._20_4_ = uVar4;
    auVar11._24_4_ = uVar4;
    auVar11._28_4_ = uVar4;
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar11,*(undefined1 (*) [32])(uVar24 + 0x40));
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar11,*(undefined1 (*) [32])(uVar24 + 0x60));
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar11,*(undefined1 (*) [32])(uVar24 + 0x80));
    auVar49._8_4_ = 0x7fffffff;
    auVar49._0_8_ = 0x7fffffff7fffffff;
    auVar49._12_4_ = 0x7fffffff;
    auVar49._16_4_ = 0x7fffffff;
    auVar49._20_4_ = 0x7fffffff;
    auVar49._24_4_ = 0x7fffffff;
    auVar49._28_4_ = 0x7fffffff;
    auVar38 = vandps_avx(auVar49,ZEXT1632(auVar15));
    auVar36._8_4_ = 0x219392ef;
    auVar36._0_8_ = 0x219392ef219392ef;
    auVar36._12_4_ = 0x219392ef;
    auVar36._16_4_ = 0x219392ef;
    auVar36._20_4_ = 0x219392ef;
    auVar36._24_4_ = 0x219392ef;
    auVar36._28_4_ = 0x219392ef;
    auVar38 = vcmpps_avx(auVar38,auVar36,1);
    auVar11 = vblendvps_avx(ZEXT1632(auVar15),auVar36,auVar38);
    auVar38 = vandps_avx(ZEXT1632(auVar16),auVar49);
    auVar38 = vcmpps_avx(auVar38,auVar36,1);
    auVar40 = vblendvps_avx(ZEXT1632(auVar16),auVar36,auVar38);
    auVar38 = vandps_avx(ZEXT1632(auVar17),auVar49);
    auVar38 = vcmpps_avx(auVar38,auVar36,1);
    auVar38 = vblendvps_avx(ZEXT1632(auVar17),auVar36,auVar38);
    auVar42 = vrcpps_avx(auVar11);
    auVar34 = vrcpps_avx(auVar40);
    auVar37._8_4_ = 0x3f800000;
    auVar37._0_8_ = 0x3f8000003f800000;
    auVar37._12_4_ = 0x3f800000;
    auVar37._16_4_ = 0x3f800000;
    auVar37._20_4_ = 0x3f800000;
    auVar37._24_4_ = 0x3f800000;
    auVar37._28_4_ = 0x3f800000;
    auVar15 = vfnmadd213ps_fma(auVar11,auVar42,auVar37);
    auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar42,auVar42);
    auVar16 = vfnmadd213ps_fma(auVar40,auVar34,auVar37);
    auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar34,auVar34);
    in_ZMM10 = ZEXT1664(auVar16);
    auVar11 = vrcpps_avx(auVar38);
    auVar17 = vfnmadd213ps_fma(auVar38,auVar11,auVar37);
    auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar11,auVar11);
    in_ZMM11 = ZEXT1664(auVar17);
    auVar40._4_4_ = fVar3;
    auVar40._0_4_ = fVar3;
    auVar40._8_4_ = fVar3;
    auVar40._12_4_ = fVar3;
    auVar40._16_4_ = fVar3;
    auVar40._20_4_ = fVar3;
    auVar40._24_4_ = fVar3;
    auVar40._28_4_ = fVar3;
    auVar18 = vfmadd213ps_fma(auVar12,auVar40,*(undefined1 (*) [32])(uVar24 + 0x160));
    auVar12._4_4_ = fVar2;
    auVar12._0_4_ = fVar2;
    auVar12._8_4_ = fVar2;
    auVar12._12_4_ = fVar2;
    auVar12._16_4_ = fVar2;
    auVar12._20_4_ = fVar2;
    auVar12._24_4_ = fVar2;
    auVar12._28_4_ = fVar2;
    auVar20 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar12,*(undefined1 (*) [32])(uVar24 + 0xa0));
    auVar18 = vfmadd213ps_fma(auVar13,auVar40,*(undefined1 (*) [32])(uVar24 + 0x180));
    auVar19 = vfmadd213ps_fma(auVar33,auVar40,*(undefined1 (*) [32])(uVar24 + 0x1a0));
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar12,*(undefined1 (*) [32])(uVar24 + 0xc0));
    auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar12,*(undefined1 (*) [32])(uVar24 + 0xe0));
    auVar13._4_4_ = fVar1;
    auVar13._0_4_ = fVar1;
    auVar13._8_4_ = fVar1;
    auVar13._12_4_ = fVar1;
    auVar13._16_4_ = fVar1;
    auVar13._20_4_ = fVar1;
    auVar13._24_4_ = fVar1;
    auVar13._28_4_ = fVar1;
    auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar13,*(undefined1 (*) [32])(uVar24 + 0x40));
    auVar35._0_4_ = auVar20._0_4_ * -auVar15._0_4_;
    auVar35._4_4_ = auVar20._4_4_ * -auVar15._4_4_;
    auVar35._8_4_ = auVar20._8_4_ * -auVar15._8_4_;
    auVar35._12_4_ = auVar20._12_4_ * -auVar15._12_4_;
    auVar35._16_4_ = 0x80000000;
    auVar35._20_4_ = 0x80000000;
    auVar35._24_4_ = 0x80000000;
    auVar35._28_4_ = 0;
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar13,*(undefined1 (*) [32])(uVar24 + 0x60));
    auVar34._0_4_ = auVar18._0_4_ * -auVar16._0_4_;
    auVar34._4_4_ = auVar18._4_4_ * -auVar16._4_4_;
    auVar34._8_4_ = auVar18._8_4_ * -auVar16._8_4_;
    auVar34._12_4_ = auVar18._12_4_ * -auVar16._12_4_;
    auVar34._16_4_ = 0x80000000;
    auVar34._20_4_ = 0x80000000;
    auVar34._24_4_ = 0x80000000;
    auVar34._28_4_ = 0;
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar13,*(undefined1 (*) [32])(uVar24 + 0x80));
    auVar33._0_4_ = auVar18._0_4_ * -auVar17._0_4_;
    auVar33._4_4_ = auVar18._4_4_ * -auVar17._4_4_;
    auVar33._8_4_ = auVar18._8_4_ * -auVar17._8_4_;
    auVar33._12_4_ = auVar18._12_4_ * -auVar17._12_4_;
    auVar33._16_4_ = 0x80000000;
    auVar33._20_4_ = 0x80000000;
    auVar33._24_4_ = 0x80000000;
    auVar33._28_4_ = 0;
    auVar38 = ZEXT1632(CONCAT412(auVar15._12_4_ + auVar35._12_4_,
                                 CONCAT48(auVar15._8_4_ + auVar35._8_4_,
                                          CONCAT44(auVar15._4_4_ + auVar35._4_4_,
                                                   auVar15._0_4_ + auVar35._0_4_))));
    auVar40 = ZEXT1632(CONCAT412(auVar16._12_4_ + auVar34._12_4_,
                                 CONCAT48(auVar16._8_4_ + auVar34._8_4_,
                                          CONCAT44(auVar16._4_4_ + auVar34._4_4_,
                                                   auVar16._0_4_ + auVar34._0_4_))));
    auVar42 = ZEXT1632(CONCAT412(auVar17._12_4_ + auVar33._12_4_,
                                 CONCAT48(auVar17._8_4_ + auVar33._8_4_,
                                          CONCAT44(auVar17._4_4_ + auVar33._4_4_,
                                                   auVar17._0_4_ + auVar33._0_4_))));
    auVar12 = vpminsd_avx2(auVar34,auVar40);
    auVar13 = vpminsd_avx2(auVar33,auVar42);
    auVar12 = vmaxps_avx(auVar12,auVar13);
    auVar11 = vpminsd_avx2(auVar35,auVar38);
    auVar38 = vpmaxsd_avx2(auVar35,auVar38);
    auVar13 = vpmaxsd_avx2(auVar34,auVar40);
    auVar33 = vpmaxsd_avx2(auVar33,auVar42);
    auVar33 = vminps_avx(auVar13,auVar33);
    auVar13 = vmaxps_avx(auVar41,auVar11);
    auVar12 = vmaxps_avx(auVar13,auVar12);
    auVar13 = vminps_avx(auVar43,auVar38);
    auVar13 = vminps_avx(auVar13,auVar33);
    auVar12 = vcmpps_avx(auVar12,auVar13,2);
    uVar23 = vmovmskps_avx(auVar12);
    bVar21 = (byte)uVar23;
  }
  if (bVar21 == 0) goto LAB_01684619;
  uVar24 = uVar27 & 0xfffffffffffffff0;
  lVar14 = 0;
  for (uVar27 = (ulong)bVar21; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    lVar14 = lVar14 + 1;
  }
  uVar27 = *(ulong *)(uVar24 + lVar14 * 8);
  uVar25 = bVar21 - 1 & (uint)bVar21;
  uVar26 = (ulong)uVar25;
  if (uVar25 != 0) {
    do {
      *puVar31 = uVar27;
      puVar31 = puVar31 + 1;
      lVar14 = 0;
      for (uVar27 = uVar26; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
        lVar14 = lVar14 + 1;
      }
      uVar26 = uVar26 - 1 & uVar26;
      uVar27 = *(ulong *)(uVar24 + lVar14 * 8);
    } while (uVar26 != 0);
  }
  goto LAB_0168462d;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }